

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

bool __thiscall FMultiBlockLinesIterator::GoUp(FMultiBlockLinesIterator *this,double x,double y)

{
  bool bVar1;
  
  if (this->continueup == true) {
    bVar1 = (this->cursector->planes[1].Flags & 0x1d0U) != 0x100;
    if (bVar1) {
      this->continueup = false;
    }
    else {
      startIteratorForGroup
                (this,(sectorPortals.Array[this->cursector->Portals[1]].mDestination)->PortalGroup);
      this->portalflags = 0x20;
    }
    return !bVar1;
  }
  return false;
}

Assistant:

bool FMultiBlockLinesIterator::GoUp(double x, double y)
{
	if (continueup)
	{
		if (!cursector->PortalBlocksMovement(sector_t::ceiling))
		{
			startIteratorForGroup(cursector->GetOppositePortalGroup(sector_t::ceiling));
			portalflags = FFCF_NOFLOOR;
			return true;
		}
		else continueup = false;
	}
	return false;
}